

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_sig.c
# Opt level: O1

err_t cmdSigRead(cmd_sig_t *sig,size_t *sig_len,char *sig_name)

{
  err_t eVar1;
  bool_t bVar2;
  octet *suffix;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  octet *poVar6;
  octet *poVar7;
  octet *der;
  size_t sVar8;
  size_t count;
  octet *val;
  der_anchor_t Signature [1];
  octet *local_80;
  octet *local_78;
  octet *local_70;
  ulong local_68;
  octet *local_60;
  der_anchor_t local_58;
  
  eVar1 = cmdFileSuffixRead((octet *)0x0,(size_t *)&local_80,sig_name,0);
  if (eVar1 != 0) {
    return eVar1;
  }
  suffix = (octet *)blobCreate((size_t)local_80);
  if (suffix == (octet *)0x0) {
    return 0x6e;
  }
  eVar1 = cmdFileSuffixRead(suffix,(size_t *)&local_80,sig_name,0);
  if (eVar1 != 0) goto LAB_001064dc;
  memRev(suffix,(size_t)local_80);
  poVar7 = local_80;
  memSet(sig,'\0',0x630);
  sVar3 = derTSEQDecStart(&local_58,suffix,(size_t)poVar7,0x30);
  poVar6 = (octet *)0xffffffffffffffff;
  if (sVar3 != 0xffffffffffffffff) {
    sVar8 = (long)poVar7 - sVar3;
    sVar4 = derDec2(&local_60,&local_68,suffix + sVar3,sVar8,0x30);
    if ((sVar4 != 0xffffffffffffffff) && (local_68 < 0x5b5)) {
      der = suffix + sVar3 + sVar4;
      sVar8 = sVar8 - sVar4;
      local_70 = sig->certs;
      sig->certs_len = local_68;
      memCopy(local_70,local_60,local_68);
      poVar7 = sig->date;
      memSet(poVar7,'\0',6);
      sVar3 = derTOCTDec2((octet *)0x0,der,sVar8,4,6);
      local_78 = poVar7;
      if (sVar3 != 0xffffffffffffffff) {
        sVar3 = derTOCTDec2(poVar7,der,sVar8,4,6);
        if (sVar3 == 0xffffffffffffffff) goto LAB_001064bc;
        der = der + sVar3;
        sVar8 = sVar8 - sVar3;
      }
      sig->sig_len = 0x22;
      sVar3 = derTOCTDec2((octet *)0x0,der,sVar8,4,0x22);
      poVar7 = local_70;
      if (sVar3 == 0xffffffffffffffff) {
        sig->sig_len = 0x30;
        sVar3 = derTOCTDec2((octet *)0x0,der,sVar8,4,0x30);
        if (sVar3 == 0xffffffffffffffff) {
          sig->sig_len = 0x48;
          sVar3 = derTOCTDec2((octet *)0x0,der,sVar8,4,0x48);
          if (sVar3 == 0xffffffffffffffff) {
            sig->sig_len = 0x60;
            sVar3 = derTOCTDec2((octet *)0x0,der,sVar8,4,0x60);
            if (sVar3 == 0xffffffffffffffff) goto LAB_001064bc;
          }
        }
      }
      sVar3 = derTOCTDec2(sig->sig,der,sVar8,4,sig->sig_len);
      if (sVar3 != 0xffffffffffffffff) {
        sVar4 = derTSEQDecStop(der + sVar3,&local_58);
        if ((((sVar4 != 0xffffffffffffffff) && (bVar2 = memIsValid(sig,0x630), bVar2 != 0)) &&
            (uVar5 = sig->sig_len - 0x22, uVar5 < 0x3f)) &&
           (((0x4000004000004001U >> (uVar5 & 0x3f) & 1) != 0 &&
            (uVar5 = sig->certs_len, poVar6 = local_78, uVar5 < 0x5b5)))) {
          for (; local_78 = poVar6, uVar5 != 0; uVar5 = uVar5 - sVar8) {
            sVar8 = btokCVCLen(poVar7,uVar5);
            if (sVar8 == 0xffffffffffffffff) goto LAB_001064bc;
            poVar7 = poVar7 + sVar8;
            poVar6 = local_78;
          }
          bVar2 = memIsZero(poVar6,6);
          if (bVar2 == 0) {
            bVar2 = tmDateIsValid2(poVar6);
            poVar6 = (octet *)0xffffffffffffffff;
            if (bVar2 == 0) goto LAB_001064c3;
          }
          poVar6 = der + sVar3 + (sVar4 - (long)suffix);
          goto LAB_001064c3;
        }
      }
    }
LAB_001064bc:
    poVar6 = (octet *)0xffffffffffffffff;
  }
LAB_001064c3:
  eVar1 = 0x1fe;
  if (poVar6 == local_80) {
    eVar1 = 0;
    if (sig_len != (size_t *)0x0) {
      *sig_len = (size_t)local_80;
      eVar1 = 0;
    }
  }
LAB_001064dc:
  blobClose(suffix);
  return eVar1;
}

Assistant:

err_t cmdSigRead(cmd_sig_t* sig, size_t* sig_len, const char* sig_name)
{
	err_t code;
	size_t count;
	octet* der;
	// pre
	ASSERT(memIsValid(sig, sizeof(cmd_sig_t)));
	ASSERT(memIsNullOrValid(sig_len, O_PER_S));
	ASSERT(strIsValid(sig_name));
	// определить длину суффикса
	code = cmdFileSuffixRead(0, &count, sig_name, 0);
	ERR_CALL_CHECK(code);
	// прочитать суффикс
	code = cmdBlobCreate(der, count);
	ERR_CALL_CHECK(code);
	code = cmdFileSuffixRead(der, &count, sig_name, 0);
	ERR_CALL_HANDLE(code, cmdBlobClose(der));
	// декодировать
	memRev(der, count);
	if (cmdSigDec(sig, der, count) != count)
		code = ERR_BAD_SIG;
	else if (sig_len)
		*sig_len = count;
	// завершить
	cmdBlobClose(der);
	return code;
}